

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

CharSetNode * __thiscall
UnifiedRegex::CharSetInner::UnionInPlace
          (CharSetInner *this,ArenaAllocator *allocator,uint level,CharSetNode *other)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  CharSetNode *pCVar6;
  undefined4 extraout_var;
  uint local_40;
  uint i;
  bool isFull;
  CharSetInner *otherInner;
  CharSetNode *other_local;
  uint level_local;
  ArenaAllocator *allocator_local;
  CharSetInner *this_local;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x1f8,"(level > 0)","level > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((other == (CharSetNode *)0x0) || (other == (CharSetNode *)&CharSetFull::Instance)) ||
     (uVar3 = (*other->_vptr_CharSetNode[0xd])(), (uVar3 & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x1f9,
                       "(other != nullptr && other != CharSetFull::TheFullNode && !other->IsLeaf())"
                       ,"other != nullptr && other != CharSetFull::TheFullNode && !other->IsLeaf()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = true;
  for (local_40 = 0; local_40 < 0x10; local_40 = local_40 + 1) {
    if (other[(ulong)local_40 + 1]._vptr_CharSetNode == (_func_int **)0x0) {
      if (this->children[local_40] != (CharSetNode *)&CharSetFull::Instance) {
        bVar2 = false;
      }
    }
    else if (other[(ulong)local_40 + 1]._vptr_CharSetNode == (_func_int **)&CharSetFull::Instance) {
      if (this->children[local_40] != (CharSetNode *)0x0) {
        (**this->children[local_40]->_vptr_CharSetNode)(this->children[local_40],allocator);
      }
      this->children[local_40] = (CharSetNode *)&CharSetFull::Instance;
    }
    else {
      if (this->children[local_40] == (CharSetNode *)0x0) {
        pCVar6 = CharSetNode::For(allocator,level - 1);
        this->children[local_40] = pCVar6;
      }
      iVar4 = (*this->children[local_40]->_vptr_CharSetNode[4])
                        (this->children[local_40],allocator,(ulong)(level - 1),
                         other[(ulong)local_40 + 1]._vptr_CharSetNode);
      this->children[local_40] = (CharSetNode *)CONCAT44(extraout_var,iVar4);
      if (this->children[local_40] != (CharSetNode *)&CharSetFull::Instance) {
        bVar2 = false;
      }
    }
  }
  this_local = this;
  if (bVar2) {
    FreeSelf(this,allocator);
    this_local = (CharSetInner *)&CharSetFull::Instance;
  }
  return &this_local->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetInner::UnionInPlace(ArenaAllocator* allocator, uint level, const CharSetNode* other)
    {
        Assert(level > 0);
        Assert(other != nullptr && other != CharSetFull::TheFullNode && !other->IsLeaf());
        CharSetInner* otherInner = (CharSetInner*)other;
        level--;
        bool isFull = true;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (otherInner->children[i] != nullptr)
            {
                if (otherInner->children[i] == CharSetFull::TheFullNode)
                {
                    if (children[i] != nullptr)
                        children[i]->FreeSelf(allocator);
                    children[i] = CharSetFull::TheFullNode;
                }
                else
                {
                    if (children[i] == nullptr)
                        children[i] = For(allocator, level);
                    children[i] = children[i]->UnionInPlace(allocator, level, otherInner->children[i]);
                    if (children[i] != CharSetFull::TheFullNode)
                        isFull = false;
                }
            }
            else if (children[i] != CharSetFull::TheFullNode)
                isFull = false;
        }
        if (isFull)
        {
            FreeSelf(allocator);
            return CharSetFull::TheFullNode;
        }
        else
            return this;
    }